

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdconntable.c
# Opt level: O1

int HashInStdResTbl(char *s)

{
  uint uVar1;
  char cVar2;
  char *pcVar3;
  
  cVar2 = *s;
  if (cVar2 != '\0') {
    pcVar3 = s + 1;
    uVar1 = 0;
    do {
      uVar1 = uVar1 * 0x10 + (int)cVar2;
      uVar1 = uVar1 & 0xfffffff ^ uVar1 >> 0x18 & 0xfffffff0;
      cVar2 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar2 != '\0');
    return uVar1 % 0xa39;
  }
  return 0;
}

Assistant:

int HashInStdResTbl(char *s) {
   unsigned h, g;

   for (h = 0; *s != '\0'; s++) {
      h = (h<<4) + *s;
      if ( (g = h & 0xf0000000) ) {
	 h ^= g >> 24;
	 h ^= g;
      }
   }
   return h % M;
}